

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ecmult_const_mult_zero_one(void)

{
  int iVar1;
  secp256k1_ge point;
  secp256k1_ge res2;
  secp256k1_gej res1;
  secp256k1_scalar negone;
  secp256k1_scalar one;
  secp256k1_scalar zero;
  secp256k1_scalar *in_stack_00000740;
  secp256k1_ge *in_stack_00000748;
  secp256k1_gej *in_stack_00000750;
  secp256k1_gej *in_stack_fffffffffffffe68;
  secp256k1_gej *in_stack_fffffffffffffe70;
  secp256k1_scalar *in_stack_fffffffffffffe78;
  secp256k1_scalar *in_stack_fffffffffffffe80;
  secp256k1_ge *in_stack_fffffffffffffe90;
  secp256k1_gej *in_stack_fffffffffffffeb8;
  secp256k1_ge *in_stack_fffffffffffffec0;
  undefined1 local_20 [32];
  
  memset(local_20,0,0x20);
  secp256k1_scalar_negate(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  random_group_element_test(in_stack_fffffffffffffe90);
  secp256k1_ecmult_const(in_stack_00000750,in_stack_00000748,in_stack_00000740);
  secp256k1_ge_set_gej(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x13b7dc);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x123b,"test condition failed: secp256k1_ge_is_infinity(&res2)");
    abort();
  }
  secp256k1_ecmult_const(in_stack_00000750,in_stack_00000748,in_stack_00000740);
  secp256k1_ge_set_gej(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  ge_equals_ge((secp256k1_ge *)in_stack_fffffffffffffe70,(secp256k1_ge *)in_stack_fffffffffffffe68);
  secp256k1_ecmult_const(in_stack_00000750,in_stack_00000748,in_stack_00000740);
  secp256k1_gej_neg(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  secp256k1_ge_set_gej(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  ge_equals_ge((secp256k1_ge *)in_stack_fffffffffffffe70,(secp256k1_ge *)in_stack_fffffffffffffe68);
  return;
}

Assistant:

static void ecmult_const_mult_zero_one(void) {
    secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    secp256k1_scalar one = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 1);
    secp256k1_scalar negone;
    secp256k1_gej res1;
    secp256k1_ge res2;
    secp256k1_ge point;
    secp256k1_scalar_negate(&negone, &one);

    random_group_element_test(&point);
    secp256k1_ecmult_const(&res1, &point, &zero);
    secp256k1_ge_set_gej(&res2, &res1);
    CHECK(secp256k1_ge_is_infinity(&res2));
    secp256k1_ecmult_const(&res1, &point, &one);
    secp256k1_ge_set_gej(&res2, &res1);
    ge_equals_ge(&res2, &point);
    secp256k1_ecmult_const(&res1, &point, &negone);
    secp256k1_gej_neg(&res1, &res1);
    secp256k1_ge_set_gej(&res2, &res1);
    ge_equals_ge(&res2, &point);
}